

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

void asmjit::CodeHolder_setGlobalOption(CodeHolder *self,uint32_t clear,uint32_t add)

{
  CodeEmitter *emitter;
  uint32_t add_local;
  uint32_t clear_local;
  CodeHolder *self_local;
  
  self->_globalOptions = self->_globalOptions & (clear ^ 0xffffffff) | add;
  for (emitter = self->_emitters; emitter != (CodeEmitter *)0x0; emitter = emitter->_nextEmitter) {
    emitter->_globalOptions = emitter->_globalOptions & (clear ^ 0xffffffff) | add;
  }
  return;
}

Assistant:

static void CodeHolder_setGlobalOption(CodeHolder* self, uint32_t clear, uint32_t add) noexcept {
  // Modify global options of `CodeHolder` itself.
  self->_globalOptions = (self->_globalOptions & ~clear) | add;

  // Modify all global options of all `CodeEmitter`s attached.
  CodeEmitter* emitter = self->_emitters;
  while (emitter) {
    emitter->_globalOptions = (emitter->_globalOptions & ~clear) | add;
    emitter = emitter->_nextEmitter;
  }
}